

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsLib.cpp
# Opt level: O3

long __thiscall bhf::ads::SendRecv(ads *this,string *remote,Frame *f,uint32_t serviceId)

{
  uint uVar1;
  size_t sVar2;
  ostream *poVar3;
  undefined4 in_register_0000000c;
  size_t __n;
  void *__buf;
  long lVar4;
  stringstream stream;
  timeval timeout;
  UdpSocket s;
  string local_280;
  code *local_260;
  addrinfo *local_258;
  undefined1 local_250 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  uint auStack_228 [22];
  ios_base local_1d0 [264];
  undefined8 local_c8;
  undefined8 uStack_c0;
  Socket local_b8;
  
  __n = CONCAT44(in_register_0000000c,serviceId);
  local_250._0_4_ = (uint)f;
  Frame::prepend((Frame *)remote,local_250,4);
  local_250._0_4_ = 0;
  Frame::prepend((Frame *)remote,local_250,4);
  local_250._0_4_ = 0x71146603;
  Frame::prepend((Frame *)remote,local_250,4);
  local_250._0_8_ = local_250 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"48899","");
  GetListOfAddresses((ads *)&local_260,(string *)this,(string *)local_250);
  if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
    operator_delete((void *)local_250._0_8_);
  }
  UdpSocket::UdpSocket((UdpSocket *)&local_b8,local_258);
  Socket::write(&local_b8,(int)remote,__buf,__n);
  Frame::reset((Frame *)remote,0x1000);
  local_c8 = 5;
  uStack_c0 = 0;
  Socket::read(&local_b8,(int)remote,&local_c8,__n);
  sVar2 = Frame::capacity((Frame *)remote);
  if (sVar2 < 0xc) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_250);
    poVar3 = (ostream *)(local_250 + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"SendRecv",8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"(): frame too short to be AMS response \'0x",0x2a);
    *(uint *)((long)auStack_228 + *(long *)(local_240._M_allocated_capacity - 0x18)) =
         *(uint *)((long)auStack_228 + *(long *)(local_240._M_allocated_capacity - 0x18)) &
         0xffffffb5 | 8;
    Frame::capacity((Frame *)remote);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'\n",2);
    std::__cxx11::stringbuf::str();
    Logger::Log(3,&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_250);
    std::ios_base::~ios_base(local_1d0);
    lVar4 = 0x705;
  }
  else {
    uVar1 = Frame::pop<unsigned_int>((Frame *)remote);
    if (uVar1 == 0x71146603) {
      uVar1 = Frame::pop<unsigned_int>((Frame *)remote);
      if (uVar1 == 0) {
        uVar1 = Frame::pop<unsigned_int>((Frame *)remote);
        if (((uint)f | 0x80000000) == uVar1) {
          lVar4 = 0;
          goto LAB_00119eed;
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_250);
        poVar3 = (ostream *)(local_250 + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"SendRecv",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"(): response contains invalid serviceId \'",0x29);
        *(uint *)((long)auStack_228 + *(long *)(local_240._M_allocated_capacity - 0x18)) =
             *(uint *)((long)auStack_228 + *(long *)(local_240._M_allocated_capacity - 0x18)) &
             0xffffffb5 | 8;
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'\n",2);
        std::__cxx11::stringbuf::str();
        Logger::Log(3,&local_280);
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)local_250);
        poVar3 = (ostream *)(local_250 + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"SendRecv",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"(): response contains invalid invokeId \'",0x28);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'\n",2);
        std::__cxx11::stringbuf::str();
        Logger::Log(3,&local_280);
      }
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)local_250);
      poVar3 = (ostream *)(local_250 + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"SendRecv",8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"(): response contains invalid cookie \'",0x26);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'\n",2);
      std::__cxx11::stringbuf::str();
      Logger::Log(3,&local_280);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_250);
    std::ios_base::~ios_base(local_1d0);
    lVar4 = 0x706;
  }
LAB_00119eed:
  Socket::~Socket(&local_b8);
  if (local_258 != (addrinfo *)0x0) {
    (*local_260)();
  }
  return lVar4;
}

Assistant:

static long SendRecv(const std::string& remote, Frame& f, const uint32_t serviceId)
{
    f.prepend(htole(serviceId));

    static const uint32_t invokeId = 0;
    f.prepend(htole(invokeId));

    static const uint32_t UDP_COOKIE = 0x71146603;
    f.prepend(htole(UDP_COOKIE));

    const auto addresses = GetListOfAddresses(remote, "48899");
    UdpSocket s{addresses.get()};
    s.write(f);
    f.reset();

    static constexpr auto headerLength = sizeof(serviceId) + sizeof(invokeId) + sizeof(UDP_COOKIE);
    timeval timeout { 5, 0 };
    s.read(f, &timeout);
    if (headerLength > f.capacity()) {
        LOG_ERROR(__FUNCTION__ << "(): frame too short to be AMS response '0x" << std::hex << f.capacity() << "'\n");
        return ADSERR_DEVICE_INVALIDSIZE;
    }

    const auto cookie = f.pop_letoh<uint32_t>();
    if (UDP_COOKIE != cookie) {
        LOG_ERROR(__FUNCTION__ << "(): response contains invalid cookie '" << cookie << "'\n");
        return ADSERR_DEVICE_INVALIDDATA;
    }
    const auto invoke = f.pop_letoh<uint32_t>();
    if (invokeId != invoke) {
        LOG_ERROR(__FUNCTION__ << "(): response contains invalid invokeId '" << invoke << "'\n");
        return ADSERR_DEVICE_INVALIDDATA;
    }
    const auto service = f.pop_letoh<uint32_t>();
    if ((UdpServiceId::RESPONSE | serviceId) != service) {
        LOG_ERROR(__FUNCTION__ << "(): response contains invalid serviceId '" << std::hex << service << "'\n");
        return ADSERR_DEVICE_INVALIDDATA;
    }
    return 0;
}